

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedWrite::pumpTo
          (BlockedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  Fault FVar1;
  bool bVar2;
  Exception *pEVar3;
  uchar *puVar4;
  PromiseNode *pPVar5;
  ArrayPtr<const_unsigned_char> *pAVar6;
  size_t sVar7;
  ulong start;
  Exception *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  ArrayPtr<const_unsigned_char> AVar8;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> AVar9;
  ArrayPtr<const_unsigned_char> AVar10;
  Promise<unsigned_long> PVar11;
  AsyncOutputStream *local_1d0;
  uchar *local_1c8;
  uchar *puStack_1c0;
  size_t local_1b8;
  size_t sStack_1b0;
  Exception *local_1a8;
  Promise<void> local_1a0;
  uint64_t local_188;
  uchar *local_180;
  uchar *puStack_178;
  Promise<void> local_170;
  undefined1 auStack_160 [8];
  ArrayPtr<const_unsigned_char> prefix;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> newMorePieces;
  ArrayPtr<const_unsigned_char> newWriteBuffer;
  Fault f_1;
  ArrayPtr<const_unsigned_char> splitPiece;
  uint64_t n;
  AsyncOutputStream *local_108;
  uint64_t local_100;
  Exception *local_f8;
  size_t local_f0;
  Promise<void> local_e8;
  uint64_t local_d0;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_c8;
  Promise<void> local_b8;
  ArrayPtr<const_unsigned_char> *pAStack_a8;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> more;
  Promise<void> promise;
  size_t i;
  uint64_t actual;
  AsyncOutputStream *local_70;
  Exception *local_68;
  Type local_60;
  Promise<void> local_50 [2];
  Fault local_30;
  Fault f;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  BlockedWrite *this_local;
  
  f.exception = in_RCX;
  bVar2 = Canceler::isEmpty((Canceler *)(output + 8));
  FVar1.exception = f.exception;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x180,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  pEVar3 = (Exception *)
           ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)(output + 4));
  if (FVar1.exception < pEVar3) {
    puVar4 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)(output + 4));
    (*(code *)**(undefined8 **)amount)(&local_60,amount,puVar4,f.exception);
    local_68 = f.exception;
    local_70 = output;
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,kj::_::PropagateException>
              (local_50,&local_60,(PropagateException *)&local_70);
    Canceler::wrap<unsigned_long>((Canceler *)this,(Promise<unsigned_long> *)(output + 8));
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_50);
    Promise<void>::~Promise((Promise<void> *)&local_60);
    pPVar5 = extraout_RDX;
  }
  else {
    i = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)(output + 4));
    promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    while( true ) {
      pPVar5 = (PromiseNode *)
               ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6));
      FVar1 = f;
      bVar2 = false;
      if (promise.super_PromiseBase.node.ptr < pPVar5) {
        pAVar6 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                           ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6),
                            (size_t)promise.super_PromiseBase.node.ptr);
        sVar7 = ArrayPtr<const_unsigned_char>::size(pAVar6);
        bVar2 = (Exception *)(i + sVar7) <= FVar1.exception;
      }
      if (!bVar2) break;
      pAVar6 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6),
                          (size_t)promise.super_PromiseBase.node.ptr);
      sVar7 = ArrayPtr<const_unsigned_char>::size(pAVar6);
      i = sVar7 + i;
      promise.super_PromiseBase.node.ptr =
           (PromiseNode *)((long)&(promise.super_PromiseBase.node.ptr)->_vptr_PromiseNode + 1);
    }
    puVar4 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)(output + 4));
    sVar7 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)(output + 4));
    (*(code *)**(undefined8 **)amount)(&more.size_,amount,puVar4,sVar7);
    if (promise.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_c8 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                           ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6),0,
                            (size_t)promise.super_PromiseBase.node.ptr);
      more.ptr = (ArrayPtr<const_unsigned_char> *)local_c8.size_;
      pAStack_a8 = local_c8.ptr;
      local_d0 = amount;
      Promise<void>::
      then<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_2_,kj::_::PropagateException>
                (&local_b8,(Type *)&more.size_,(PropagateException *)&local_d0);
      Promise<void>::operator=((Promise<void> *)&more.size_,&local_b8);
      Promise<void>::~Promise(&local_b8);
    }
    pPVar5 = (PromiseNode *)
             ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6));
    if (promise.super_PromiseBase.node.ptr == pPVar5) {
      local_f8 = f.exception;
      local_f0 = i;
      local_108 = output;
      local_100 = amount;
      Promise<void>::
      then<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_3_,kj::_::PropagateException>
                (&local_e8,(Type *)&more.size_,(PropagateException *)&local_108);
      Canceler::wrap<unsigned_long>((Canceler *)this,(Promise<unsigned_long> *)(output + 8));
      Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_e8);
    }
    else {
      start = (long)f.exception - i;
      pAVar6 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6),
                          (size_t)promise.super_PromiseBase.node.ptr);
      f_1.exception = (Exception *)pAVar6->ptr;
      sVar7 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&f_1);
      if (sVar7 < start) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&newWriteBuffer.size_,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x1b0,FAILED,"n <= splitPiece.size()","");
        kj::_::Debug::Fault::fatal((Fault *)&newWriteBuffer.size_);
      }
      sVar7 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&f_1);
      AVar8 = ArrayPtr<const_unsigned_char>::slice
                        ((ArrayPtr<const_unsigned_char> *)&f_1,start,sVar7);
      newWriteBuffer.ptr = (uchar *)AVar8.size_;
      sVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6));
      AVar9 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)(output + 6),
                         (size_t)((long)&(promise.super_PromiseBase.node.ptr)->_vptr_PromiseNode + 1
                                 ),sVar7);
      prefix.size_ = (size_t)AVar9.ptr;
      AVar10 = ArrayPtr<const_unsigned_char>::slice((ArrayPtr<const_unsigned_char> *)&f_1,0,start);
      prefix.ptr = (uchar *)AVar10.size_;
      auStack_160 = (undefined1  [8])AVar10.ptr;
      sVar7 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_160);
      if (sVar7 != 0) {
        local_180 = (uchar *)auStack_160;
        puStack_178 = prefix.ptr;
        local_188 = amount;
        Promise<void>::
        then<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_4_,kj::_::PropagateException>
                  (&local_170,(Type *)&more.size_,(PropagateException *)&local_188);
        Promise<void>::operator=((Promise<void> *)&more.size_,&local_170);
        Promise<void>::~Promise(&local_170);
      }
      puStack_1c0 = newWriteBuffer.ptr;
      local_1b8 = prefix.size_;
      local_1a8 = f.exception;
      local_1d0 = output;
      local_1c8 = AVar8.ptr;
      sStack_1b0 = AVar9.size_;
      Promise<void>::
      then<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_5_,kj::_::PropagateException>
                (&local_1a0,(Type *)&more.size_,(PropagateException *)&local_1d0);
      Canceler::wrap<unsigned_long>((Canceler *)this,(Promise<unsigned_long> *)(output + 8));
      Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_1a0);
    }
    Promise<void>::~Promise((Promise<void> *)&more.size_);
    pPVar5 = extraout_RDX_00;
  }
  PVar11.super_PromiseBase.node.ptr = pPVar5;
  PVar11.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar11.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      if (amount < writeBuffer.size()) {
        // Consume a portion of the write buffer.
        return canceler.wrap(output.write(writeBuffer.begin(), amount)
            .then([this,amount]() {
          writeBuffer = writeBuffer.slice(amount, writeBuffer.size());
          // We pumped the full amount, so we're done pumping.
          return amount;
        }));
      }

      // First piece doesn't cover the whole pump. Figure out how many more pieces to add.
      uint64_t actual = writeBuffer.size();
      size_t i = 0;
      while (i < morePieces.size() &&
             amount >= actual + morePieces[i].size()) {
        actual += morePieces[i++].size();
      }

      // Write the first piece.
      auto promise = output.write(writeBuffer.begin(), writeBuffer.size());

      // Write full pieces as a single gather-write.
      if (i > 0) {
        auto more = morePieces.slice(0, i);
        promise = promise.then([&output,more]() { return output.write(more); });
      }

      if (i == morePieces.size()) {
        // This will complete the write.
        return canceler.wrap(promise.then([this,&output,amount,actual]() -> Promise<uint64_t> {
          canceler.release();
          fulfiller.fulfill();
          pipe.endState(*this);

          if (actual == amount) {
            // Oh, we had exactly enough.
            return actual;
          } else {
            return pipe.pumpTo(output, amount - actual)
                .then([actual](uint64_t actual2) { return actual + actual2; });
          }
        }));
      } else {
        // Pump ends mid-piece. Write the last, partial piece.
        auto n = amount - actual;
        auto splitPiece = morePieces[i];
        KJ_ASSERT(n <= splitPiece.size());
        auto newWriteBuffer = splitPiece.slice(n, splitPiece.size());
        auto newMorePieces = morePieces.slice(i + 1, morePieces.size());
        auto prefix = splitPiece.slice(0, n);
        if (prefix.size() > 0) {
          promise = promise.then([&output,prefix]() {
            return output.write(prefix.begin(), prefix.size());
          });
        }

        return canceler.wrap(promise.then([this,newWriteBuffer,newMorePieces,amount]() {
          writeBuffer = newWriteBuffer;
          morePieces = newMorePieces;
          canceler.release();
          return amount;
        }));
      }
    }